

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O1

int RSA_decrypt(RSA *rsa,size_t *out_len,uint8_t *out,size_t max_out,uint8_t *in,size_t in_len,
               int padding)

{
  _func_int_RSA_ptr_size_t_ptr_uint8_t_ptr_size_t_uint8_t_ptr_size_t_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  uint uVar2;
  byte *out_00;
  ulong size;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  UNRECOVERED_JUMPTABLE = rsa->meth->decrypt;
  if (UNRECOVERED_JUMPTABLE !=
      (_func_int_RSA_ptr_size_t_ptr_uint8_t_ptr_size_t_uint8_t_ptr_size_t_int *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(rsa,out_len,out,max_out,in,in_len,padding);
    return iVar1;
  }
  uVar2 = RSA_size((RSA *)rsa);
  size = (ulong)uVar2;
  if (max_out < size) {
    ERR_put_error(4,0,0x87,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0x1af);
    return 0;
  }
  out_00 = out;
  if ((padding != 3) && (out_00 = (byte *)OPENSSL_malloc(size), out_00 == (byte *)0x0)) {
    out_00 = (byte *)0x0;
    iVar3 = 0;
    goto LAB_0019ce4c;
  }
  if (size == in_len) {
    iVar1 = rsa_private_transform(rsa,out_00,in,size);
    if (iVar1 == 0) {
      iVar3 = 0;
      goto LAB_0019ce4c;
    }
    if (padding == 4) {
      iVar1 = RSA_padding_check_PKCS1_OAEP_mgf1
                        (out,out_len,size,out_00,size,(uint8_t *)0x0,0,(EVP_MD *)0x0,(EVP_MD *)0x0);
      iVar3 = 1;
      if (iVar1 != 0) goto LAB_0019ce4c;
    }
    else {
      if (padding == 3) {
        *out_len = size;
        iVar3 = 1;
        goto LAB_0019ce4c;
      }
      if (padding != 1) {
        iVar1 = 0x8f;
        iVar5 = 0x1d5;
        goto LAB_0019cdf7;
      }
      if (size == 0) {
        iVar1 = 0x78;
        iVar5 = 0xf7;
      }
      else if (uVar2 < 0xb) {
        iVar1 = 0x7e;
        iVar5 = 0x100;
      }
      else {
        uVar8 = 2;
        uVar9 = 0xffffffffffffffff;
        uVar4 = 0;
        do {
          uVar10 = (long)((ulong)out_00[uVar8] - 1) >> 0x3f;
          uVar6 = uVar10 & uVar9;
          uVar7 = ~uVar6 & uVar4;
          uVar4 = uVar6 & uVar8 | uVar7;
          uVar9 = ~uVar10 & uVar9;
          uVar8 = uVar8 + 1;
        } while (size != uVar8);
        if ((((long)(9 - uVar4 | uVar7) < 0) &&
            ((long)(((ulong)out_00[1] ^ 2) - 1 & (ulong)*out_00 - 1) < 0)) &&
           (uVar9 != 0xffffffffffffffff)) {
          uVar4 = uVar4 + 1;
          if (uVar4 <= size) {
            if (size - uVar4 != 0) {
              memcpy(out,out_00 + uVar4,size - uVar4);
            }
            *out_len = 0;
            iVar3 = 1;
            goto LAB_0019ce4c;
          }
          iVar1 = 0x89;
          iVar5 = 0x12d;
        }
        else {
          iVar1 = 0x89;
          iVar5 = 0x125;
        }
      }
      ERR_put_error(4,0,iVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                    ,iVar5);
    }
    iVar1 = 0x88;
    iVar5 = 0x1db;
  }
  else {
    iVar1 = 0x70;
    iVar5 = 0x1be;
  }
LAB_0019cdf7:
  iVar3 = 0;
  ERR_put_error(4,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                ,iVar5);
LAB_0019ce4c:
  if (padding != 3) {
    OPENSSL_free(out_00);
  }
  return iVar3;
}

Assistant:

int RSA_decrypt(RSA *rsa, size_t *out_len, uint8_t *out, size_t max_out,
                const uint8_t *in, size_t in_len, int padding) {
  if (rsa->meth->decrypt) {
    return rsa->meth->decrypt(rsa, out_len, out, max_out, in, in_len, padding);
  }

  return rsa_default_decrypt(rsa, out_len, out, max_out, in, in_len, padding);
}